

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O0

void __thiscall irr::scene::CSceneManager::clearAllRegisteredNodesForRendering(CSceneManager *this)

{
  array<irr::scene::CSceneManager::DefaultNodeEntry> *unaff_retaddr;
  
  core::array<irr::scene::ISceneNode_*>::clear((array<irr::scene::ISceneNode_*> *)unaff_retaddr);
  core::array<irr::scene::ISceneNode_*>::clear((array<irr::scene::ISceneNode_*> *)unaff_retaddr);
  core::array<irr::scene::CSceneManager::DefaultNodeEntry>::clear(unaff_retaddr);
  core::array<irr::scene::CSceneManager::TransparentNodeEntry>::clear
            ((array<irr::scene::CSceneManager::TransparentNodeEntry> *)unaff_retaddr);
  core::array<irr::scene::CSceneManager::TransparentNodeEntry>::clear
            ((array<irr::scene::CSceneManager::TransparentNodeEntry> *)unaff_retaddr);
  core::array<irr::scene::ISceneNode_*>::clear((array<irr::scene::ISceneNode_*> *)unaff_retaddr);
  return;
}

Assistant:

void CSceneManager::clearAllRegisteredNodesForRendering()
{
	CameraList.clear();
	SkyBoxList.clear();
	SolidNodeList.clear();
	TransparentNodeList.clear();
	TransparentEffectNodeList.clear();
	GuiNodeList.clear();
}